

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_initsessions(Curl_easy *data,size_t amount)

{
  curl_ssl_session *pcVar1;
  CURLcode CVar2;
  
  CVar2 = CURLE_OK;
  if ((data->state).session == (curl_ssl_session *)0x0) {
    pcVar1 = (curl_ssl_session *)(*Curl_ccalloc)(amount,0x78);
    if (pcVar1 == (curl_ssl_session *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      (data->set).general_ssl.max_ssl_sessions = amount;
      (data->state).session = pcVar1;
      (data->state).sessionage = 1;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_ssl_initsessions(struct Curl_easy *data, size_t amount)
{
  struct curl_ssl_session *session;

  if(data->state.session)
    /* this is just a precaution to prevent multiple inits */
    return CURLE_OK;

  session = calloc(amount, sizeof(struct curl_ssl_session));
  if(!session)
    return CURLE_OUT_OF_MEMORY;

  /* store the info in the SSL section */
  data->set.general_ssl.max_ssl_sessions = amount;
  data->state.session = session;
  data->state.sessionage = 1; /* this is brand new */
  return CURLE_OK;
}